

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O0

RPCHelpMan * getrawmempool(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_ffffffffffffee58;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffee60;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffee68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee70;
  RPCResults *in_stack_ffffffffffffee80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee90;
  UniValue *in_stack_ffffffffffffee98;
  iterator in_stack_ffffffffffffeea0;
  RPCArgOptions *in_stack_ffffffffffffeea8;
  string *in_stack_ffffffffffffeeb0;
  undefined7 in_stack_ffffffffffffeeb8;
  undefined1 in_stack_ffffffffffffeebf;
  undefined4 in_stack_ffffffffffffeec0;
  Type in_stack_ffffffffffffeec4;
  string *in_stack_ffffffffffffeec8;
  undefined4 in_stack_ffffffffffffeed0;
  Type in_stack_ffffffffffffeed4;
  undefined4 in_stack_ffffffffffffeed8;
  Type in_stack_ffffffffffffeedc;
  RPCResult *in_stack_ffffffffffffeee0;
  undefined1 *local_1090;
  undefined1 *local_1078;
  RPCExamples *in_stack_ffffffffffffefa0;
  RPCResults *in_stack_ffffffffffffefa8;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffefb0;
  string *in_stack_ffffffffffffefb8;
  string *in_stack_ffffffffffffefc0;
  RPCHelpMan *in_stack_ffffffffffffefc8;
  undefined1 *local_1030;
  undefined1 *local_1018;
  RPCMethodImpl *fun;
  undefined1 local_de0 [36];
  allocator<char> local_dbc;
  allocator<char> local_dbb;
  allocator<char> local_dba [2];
  pointer local_db8;
  pointer pRStack_db0;
  pointer local_da8;
  allocator<char> local_d9b;
  allocator<char> local_d9a [32];
  allocator<char> local_d7a;
  allocator<char> local_d79 [31];
  allocator<char> local_d5a;
  allocator<char> local_d59 [29];
  allocator<char> local_d3c;
  allocator<char> local_d3b;
  allocator<char> local_d3a [32];
  allocator<char> local_d1a;
  allocator<char> local_d19 [29];
  allocator<char> local_cfc;
  allocator<char> local_cfb;
  undefined1 local_cfa [18];
  pointer local_ce8;
  allocator<char> local_cda;
  allocator<char> local_cd9 [30];
  allocator<char> local_cbb;
  allocator<char> local_cba;
  allocator<char> local_cb9 [27];
  allocator<char> local_c9e;
  undefined1 local_c9d;
  allocator<char> local_c9c;
  allocator<char> local_c9b;
  undefined1 local_c9a;
  allocator<char> local_c99 [31];
  allocator<char> local_c7a;
  allocator<char> local_c79 [385];
  undefined1 local_af8 [136];
  undefined1 local_a70 [64];
  undefined1 local_a30 [272];
  undefined1 local_920 [160];
  undefined1 local_880 [136];
  undefined1 local_7f8 [160];
  undefined1 local_758 [136];
  undefined1 local_6d0 [96];
  undefined1 local_670 [408];
  undefined1 local_4d8 [40];
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined1 local_498;
  undefined1 local_497;
  undefined1 local_398;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined1 local_358;
  undefined1 local_357;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  local_c9a = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffee98,(bool *)in_stack_ffffffffffffee90);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  local_398 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffee70);
  local_370 = 0;
  uStack_368 = 0;
  local_360 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffee58);
  local_358 = 0;
  local_357 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                 in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffeebf,in_stack_ffffffffffffeeb8),
                 in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  local_c9d = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffee98,(bool *)in_stack_ffffffffffffee90);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  local_4d8[0] = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffee70);
  local_4b0 = 0;
  uStack_4a8 = 0;
  local_4a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffee58);
  local_498 = 0;
  local_497 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                 in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffeebf,in_stack_ffffffffffffeeb8),
                 in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_ffffffffffffee58);
  __l._M_len = (size_type)in_stack_ffffffffffffeea8;
  __l._M_array = in_stack_ffffffffffffeea0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffee98,__l,
             (allocator_type *)in_stack_ffffffffffffee90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  local_cfa._2_8_ = 0;
  local_cfa._10_8_ = (pointer)0x0;
  local_ce8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee58);
  RPCResult::RPCResult
            (in_stack_ffffffffffffeee0,in_stack_ffffffffffffeedc,
             (string *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
             in_stack_ffffffffffffeec8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
             (bool)in_stack_ffffffffffffeebf);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffee58);
  __l_00._M_len = (size_type)in_stack_ffffffffffffeea8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffeea0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee98,__l_00,
             (allocator_type *)in_stack_ffffffffffffee90);
  RPCResult::RPCResult
            (in_stack_ffffffffffffeee0,
             (string *)CONCAT44(in_stack_ffffffffffffeedc,in_stack_ffffffffffffeed8),
             in_stack_ffffffffffffeed4,in_stack_ffffffffffffeec8,
             (string *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffeebf,in_stack_ffffffffffffeeb8));
  fun = (RPCMethodImpl *)local_cfa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  MempoolEntryDescription();
  RPCResult::RPCResult
            (in_stack_ffffffffffffeee0,in_stack_ffffffffffffeedc,
             (string *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
             in_stack_ffffffffffffeec8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
             (bool)in_stack_ffffffffffffeebf);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffee58);
  __l_01._M_len = (size_type)in_stack_ffffffffffffeea8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffeea0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee98,__l_01,
             (allocator_type *)in_stack_ffffffffffffee90);
  RPCResult::RPCResult
            (in_stack_ffffffffffffeee0,
             (string *)CONCAT44(in_stack_ffffffffffffeedc,in_stack_ffffffffffffeed8),
             in_stack_ffffffffffffeed4,in_stack_ffffffffffffeec8,
             (string *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffeebf,in_stack_ffffffffffffeeb8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  local_d9a[2] = (allocator<char>)0x0;
  local_d9a[3] = (allocator<char>)0x0;
  local_d9a[4] = (allocator<char>)0x0;
  local_d9a[5] = (allocator<char>)0x0;
  local_d9a[6] = (allocator<char>)0x0;
  local_d9a[7] = (allocator<char>)0x0;
  local_d9a[8] = (allocator<char>)0x0;
  local_d9a[9] = (allocator<char>)0x0;
  local_d9a[10] = (allocator<char>)0x0;
  local_d9a[0xb] = (allocator<char>)0x0;
  local_d9a[0xc] = (allocator<char>)0x0;
  local_d9a[0xd] = (allocator<char>)0x0;
  local_d9a[0xe] = (allocator<char>)0x0;
  local_d9a[0xf] = (allocator<char>)0x0;
  local_d9a[0x10] = (allocator<char>)0x0;
  local_d9a[0x11] = (allocator<char>)0x0;
  local_d9a[0x12] = (allocator<char>)0x0;
  local_d9a[0x13] = (allocator<char>)0x0;
  local_d9a[0x14] = (allocator<char>)0x0;
  local_d9a[0x15] = (allocator<char>)0x0;
  local_d9a[0x16] = (allocator<char>)0x0;
  local_d9a[0x17] = (allocator<char>)0x0;
  local_d9a[0x18] = (allocator<char>)0x0;
  local_d9a[0x19] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee58);
  RPCResult::RPCResult
            (in_stack_ffffffffffffeee0,in_stack_ffffffffffffeedc,
             (string *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
             in_stack_ffffffffffffeec8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
             (bool)in_stack_ffffffffffffeebf);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffee58);
  __l_02._M_len = (size_type)in_stack_ffffffffffffeea8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffeea0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee98,__l_02,
             (allocator_type *)in_stack_ffffffffffffee90);
  RPCResult::RPCResult
            (in_stack_ffffffffffffeee0,in_stack_ffffffffffffeedc,
             (string *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
             in_stack_ffffffffffffeec8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
             (bool)in_stack_ffffffffffffeebf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  local_db8 = (pointer)0x0;
  pRStack_db0 = (pointer)0x0;
  local_da8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee58);
  RPCResult::RPCResult
            (in_stack_ffffffffffffeee0,in_stack_ffffffffffffeedc,
             (string *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
             in_stack_ffffffffffffeec8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
             (bool)in_stack_ffffffffffffeebf);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffee58);
  __l_03._M_len = (size_type)in_stack_ffffffffffffeea8;
  __l_03._M_array = (iterator)in_stack_ffffffffffffeea0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee98,__l_03,
             (allocator_type *)in_stack_ffffffffffffee90);
  RPCResult::RPCResult
            (in_stack_ffffffffffffeee0,
             (string *)CONCAT44(in_stack_ffffffffffffeedc,in_stack_ffffffffffffeed8),
             in_stack_ffffffffffffeed4,in_stack_ffffffffffffeec8,
             (string *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffeebf,in_stack_ffffffffffffeeb8));
  results._M_len = (size_type)in_stack_ffffffffffffeea8;
  results._M_array = (iterator)in_stack_ffffffffffffeea0;
  RPCResults::RPCResults(in_stack_ffffffffffffee80,results);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  HelpExampleCli(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeea8,(char *)in_stack_ffffffffffffeea0,
             (allocator<char> *)in_stack_ffffffffffffee98);
  HelpExampleRpc(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
  std::operator+(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_ffffffffffffee58,(string *)0x5ebb59);
  this = (RPCArg *)local_de0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getrawmempool()::__0,void>
            (in_stack_ffffffffffffee68,(anon_class_1_0_00000001 *)in_stack_ffffffffffffee60);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
             in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_de0 + 0x23));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_dbc);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_dbb);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_dba);
  RPCResults::~RPCResults((RPCResults *)this);
  local_1018 = local_4d8;
  do {
    local_1018 = local_1018 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1018 != local_670);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee68);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_a30;
  local_1030 = local_920;
  do {
    local_1030 = local_1030 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1030 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee68);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d9b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_d9a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee68);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_af8;
  puVar1 = local_a70;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee68);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_d79);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_d59);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d3c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d3b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_d3a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee68);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_7f8;
  do {
    puVar2 = puVar2 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar2 != local_880);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee68);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d1a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_d19);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_cfc);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_cfb);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_cfa);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee68);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1078 = local_6d0;
  do {
    local_1078 = local_1078 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1078 != local_758);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee68);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_cda);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_cd9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_cbb);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_cba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_cb9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffee68);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1090 = local_48;
  do {
    local_1090 = local_1090 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1090 != local_258);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c9e);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c9c);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c9b);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_c99);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_c79);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getrawmempool()
{
    return RPCHelpMan{"getrawmempool",
        "\nReturns all transaction ids in memory pool as a json array of string transaction ids.\n"
        "\nHint: use getmempoolentry to fetch a specific transaction from the mempool.\n",
        {
            {"verbose", RPCArg::Type::BOOL, RPCArg::Default{false}, "True for a json object, false for array of transaction ids"},
            {"mempool_sequence", RPCArg::Type::BOOL, RPCArg::Default{false}, "If verbose=false, returns a json object with transaction list and mempool sequence number attached."},
        },
        {
            RPCResult{"for verbose = false",
                RPCResult::Type::ARR, "", "",
                {
                    {RPCResult::Type::STR_HEX, "", "The transaction id"},
                }},
            RPCResult{"for verbose = true",
                RPCResult::Type::OBJ_DYN, "", "",
                {
                    {RPCResult::Type::OBJ, "transactionid", "", MempoolEntryDescription()},
                }},
            RPCResult{"for verbose = false and mempool_sequence = true",
                RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::ARR, "txids", "",
                    {
                        {RPCResult::Type::STR_HEX, "", "The transaction id"},
                    }},
                    {RPCResult::Type::NUM, "mempool_sequence", "The mempool sequence value."},
                }},
        },
        RPCExamples{
            HelpExampleCli("getrawmempool", "true")
            + HelpExampleRpc("getrawmempool", "true")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    bool fVerbose = false;
    if (!request.params[0].isNull())
        fVerbose = request.params[0].get_bool();

    bool include_mempool_sequence = false;
    if (!request.params[1].isNull()) {
        include_mempool_sequence = request.params[1].get_bool();
    }

    return MempoolToJSON(EnsureAnyMemPool(request.context), fVerbose, include_mempool_sequence);
},
    };
}